

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_crop.cpp
# Opt level: O0

Mat * IntArrayMat(int a0)

{
  int *piVar1;
  int in_ESI;
  Mat *in_RDI;
  int *p;
  Mat *m;
  Mat *this;
  undefined8 in_stack_ffffffffffffffe8;
  uint3 in_stack_fffffffffffffff0;
  
  this = in_RDI;
  ncnn::Mat::Mat((Mat *)CONCAT44(in_ESI,(uint)in_stack_fffffffffffffff0),
                 (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20),(size_t)in_RDI,(Allocator *)in_RDI)
  ;
  piVar1 = ncnn::Mat::operator_cast_to_int_(this);
  *piVar1 = in_ESI;
  return in_RDI;
}

Assistant:

static ncnn::Mat IntArrayMat(int a0)
{
    ncnn::Mat m(1);
    int* p = m;
    p[0] = a0;
    return m;
}